

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

QMap<int,_QVariant> __thiscall QStandardItemPrivate::itemData(QStandardItemPrivate *this)

{
  bool bVar1;
  const_iterator o;
  QStandardItemData *pQVar2;
  int *in_RSI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  QStandardItemData *data;
  QList<QStandardItemData> *__range1;
  QMap<int,_QVariant> *result;
  const_iterator __end1;
  const_iterator __begin1;
  iterator in_stack_ffffffffffffffb0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)0x8ce0ba);
  local_10.i = (QStandardItemData *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QStandardItemData>::begin((QList<QStandardItemData> *)in_RDI.d.ptr);
  o = QList<QStandardItemData>::end((QList<QStandardItemData> *)in_RDI.d.ptr);
  while (bVar1 = QList<QStandardItemData>::const_iterator::operator!=(&local_10,o), bVar1) {
    pQVar2 = QList<QStandardItemData>::const_iterator::operator*(&local_10);
    if (pQVar2->role != 0xff) {
      in_stack_ffffffffffffffb0._M_node =
           (_Base_ptr)
           QMap<int,_QVariant>::insert
                     (in_stack_ffffffffffffffb0._M_node,in_RSI,(QVariant *)in_RDI.d.ptr);
    }
    QList<QStandardItemData>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )in_RDI.d.ptr;
}

Assistant:

QMap<int, QVariant> QStandardItemPrivate::itemData() const
{
    QMap<int, QVariant> result;
    for (const auto &data : values) {
        if (data.role != DataFlagsRole)
            result.insert(data.role, data.value);
    }
    return result;
}